

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

int accept_header(flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid)

{
  byte bVar1;
  int in_EAX;
  uint uVar2;
  
  if ((buf == (void *)0x0) || (bufsiz < 8)) {
    if (ctx->error == 0) {
      ctx->error = 1;
    }
    __assert_fail("0 && \"buffer header too small\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                  ,0x4e6,
                  "int accept_header(flatcc_json_printer_t *, const void *, size_t, const char *)");
  }
  if (fid != (char *)0x0) {
    bVar1 = *fid;
    uVar2 = (uint)bVar1;
    if (bVar1 != 0) {
      if (fid[1] != '\0') {
        uVar2 = (uint)CONCAT11(fid[1],bVar1);
        if (fid[2] != 0) {
          uVar2 = uVar2 | (uint)(byte)fid[3] << 0x18 | (uint)(byte)fid[2] << 0x10;
        }
      }
      if (*(uint *)((long)buf + 4) != uVar2) {
        if (ctx->error == 0) {
          ctx->error = 1;
        }
        __assert_fail("0 && \"identifier mismatch\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                      ,0x4ee,
                      "int accept_header(flatcc_json_printer_t *, const void *, size_t, const char *)"
                     );
      }
    }
  }
  return in_EAX;
}

Assistant:

static int accept_header(flatcc_json_printer_t * ctx,
        const void *buf, size_t bufsiz, const char *fid)
{
    flatbuffers_thash_t id, id2 = 0;

    if (buf == 0 || bufsiz < offset_size + FLATBUFFERS_IDENTIFIER_SIZE) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "buffer header too small");
        return 0;
    }
    if (fid != 0) {
        id2 = flatbuffers_type_hash_from_string(fid);
        id = __flatbuffers_thash_read_from_pe((uint8_t *)buf + offset_size);
        if (!(id2 == 0 || id == id2)) {
            RAISE_ERROR(bad_input);
            FLATCC_ASSERT(0 && "identifier mismatch");
            return 0;
        }
    }
    return 1;
}